

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayTex3DValidation.cpp
# Opt level: O0

bool __thiscall
glcts::TextureCubeMapArrayTex3DValidation::checkError
          (TextureCubeMapArrayTex3DValidation *this,GLint expectedError,char *message)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar3;
  bool bVar4;
  Enum<int,_2UL> EVar5;
  Enum<int,_2UL> local_1f0;
  GetNameFunc local_1e0;
  int local_1d8;
  Enum<int,_2UL> local_1d0 [2];
  MessageBuilder local_1b0;
  bool local_2d;
  int local_2c;
  bool result;
  long lStack_28;
  GLint error;
  Functions *gl;
  char *message_local;
  TextureCubeMapArrayTex3DValidation *pTStack_10;
  GLint expectedError_local;
  TextureCubeMapArrayTex3DValidation *this_local;
  
  gl = (Functions *)message;
  message_local._4_4_ = expectedError;
  pTStack_10 = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar1);
  local_2c = (**(code **)(lStack_28 + 0x800))();
  local_2d = true;
  bVar4 = local_2c != message_local._4_4_;
  if (bVar4) {
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_1b0,(char **)&gl);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [18])" Expected error: ");
    EVar5 = glu::getErrorStr(message_local._4_4_);
    local_1e0 = EVar5.m_getName;
    local_1d8 = EVar5.m_value;
    local_1d0[0].m_getName = local_1e0;
    local_1d0[0].m_value = local_1d8;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1d0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [17])" Current error: ");
    EVar5 = glu::getErrorStr(local_2c);
    local_1f0.m_getName = EVar5.m_getName;
    local_1f0.m_value = EVar5.m_value;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1f0);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  }
  local_2d = !bVar4;
  return local_2d;
}

Assistant:

bool TextureCubeMapArrayTex3DValidation::checkError(glw::GLint expectedError, const char* message)
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	glw::GLint			  error  = gl.getError();
	bool				  result = true;

	if (error != expectedError)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << message << " Expected error: " << glu::getErrorStr(expectedError)
						   << " Current error: " << glu::getErrorStr(error) << tcu::TestLog::EndMessage;
		result = false;
	}

	return result;
}